

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_id_map_alloc(nng_id_map **map,uint64_t lo,uint64_t hi,int flags)

{
  int iVar1;
  nni_id_map *m;
  
  m = (nni_id_map *)nni_zalloc(0x38);
  if (m == (nni_id_map *)0x0) {
    iVar1 = 2;
  }
  else {
    nni_id_map_init(m,lo,hi,(_Bool)((byte)flags & 1));
    *map = (nng_id_map *)m;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nng_id_map_alloc(nng_id_map **map, uint64_t lo, uint64_t hi, int flags)
{
	nng_id_map *m;

	if ((m = NNI_ALLOC_STRUCT(m)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_id_map_init(
	    &m->m, lo, hi, (flags & NNG_MAP_RANDOM) ? true : false);
	*map = m;
	return (0);
}